

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O1

string * __thiscall
phmap::priv::hash_internal::
Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
operator()(string *__return_storage_ptr__,
          Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  uniform_int_distribution<short> chars;
  undefined4 local_1c;
  
  local_1c = 0x7e0020;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,' ');
  __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::operator()(__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )(__first._M_current + __return_storage_ptr__->_M_string_length),
                  (uniform_int_distribution<short> *)&local_1c);
  return __return_storage_ptr__;
}

Assistant:

std::string operator()() const {
        // NOLINTNEXTLINE(runtime/int)
        std::uniform_int_distribution<short> chars(0x20, 0x7E);
        std::string res;
        res.resize(32);
        std::generate(res.begin(), res.end(),
                      [&]() { return (char)chars(*GetSharedRng()); });
        return res;
    }